

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017d5f0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017d5f7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017d5e0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017d5e8 = 0x2d2d2d2d2d2d2d;
    DAT_0017d5ef = 0x2d;
    _DAT_0017d5d0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017d5d8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017d5c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017d5c8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017d5b8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017d5ff = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }